

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::GenStructObjectAPIUnpack_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  IdlNamer *pIVar1;
  Value *value;
  bool bVar2;
  BaseType BVar3;
  FieldDef *def;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer ppVar5;
  bool bVar6;
  string defaultValue;
  string constructor_args;
  string nullableValueAccessOperator;
  string offset;
  string object_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  constructor_args._M_dataplus._M_p = (pointer)&constructor_args.field_2;
  constructor_args._M_string_length = 0;
  constructor_args.field_2._M_local_buf[0] = '\0';
  ppVar5 = (non_deprecated_fields->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = &this->namer_;
  do {
    if (ppVar5 == (non_deprecated_fields->
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&object_type,pIVar1,struct_def);
      std::operator+(&offset,"  ",&object_type);
      std::operator+(&nullableValueAccessOperator,&offset," unpack() => ");
      std::operator+(&defaultValue,&nullableValueAccessOperator,&object_type);
      std::operator+(__return_storage_ptr__,&defaultValue,"(");
      std::__cxx11::string::~string((string *)&defaultValue);
      std::__cxx11::string::~string((string *)&nullableValueAccessOperator);
      std::__cxx11::string::~string((string *)&offset);
      if (constructor_args._M_string_length != 0) {
        std::operator+(&defaultValue,"\n",&constructor_args);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&defaultValue);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&object_type);
      std::__cxx11::string::~string((string *)&constructor_args);
      return __return_storage_ptr__;
    }
    def = ppVar5->second;
    (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&object_type);
    if (constructor_args._M_string_length != 0) {
      std::__cxx11::string::append((char *)&constructor_args);
    }
    std::operator+(&nullableValueAccessOperator,"      ",&object_type);
    std::operator+(&defaultValue,&nullableValueAccessOperator,": ");
    std::__cxx11::string::append((string *)&constructor_args);
    std::__cxx11::string::~string((string *)&defaultValue);
    std::__cxx11::string::~string((string *)&nullableValueAccessOperator);
    value = &def->value;
    getDefaultValue_abi_cxx11_(&defaultValue,this,value);
    bVar6 = defaultValue._M_string_length == 0;
    bVar2 = struct_def->fixed;
    __s = "?";
    if (!bVar6 || (bVar2 & 1U) != 0) {
      __s = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nullableValueAccessOperator,__s,(allocator<char> *)&offset);
    BVar3 = (value->type).base_type;
    if (BVar3 == BASE_TYPE_VECTOR) {
      if ((def->value).type.element == BASE_TYPE_STRUCT) {
        std::operator+(&local_d0,&object_type,&nullableValueAccessOperator);
        std::operator+(&offset,&local_d0,".map((e) => e.unpack()).toList()");
        std::__cxx11::string::append((string *)&constructor_args);
        goto LAB_001879f6;
      }
      GenReaderTypeName_abi_cxx11_
                (&offset,this,&value->type,(struct_def->super_Definition).defined_namespace,def,
                 false,false,true);
      std::__cxx11::string::append((string *)&constructor_args);
      std::__cxx11::string::~string((string *)&offset);
      std::__cxx11::string::append((char *)&constructor_args);
      NumToString<unsigned_short>(&offset,(def->value).offset);
      if (bVar6 && (bVar2 & 1U) == 0) {
        std::operator+(&local_50,"Nullable(_bc, _bcOffset, ",&offset);
        std::operator+(&local_d0,&local_50,")");
      }
      else {
        std::operator+(&local_b0,"(_bc, _bcOffset, ",&offset);
        std::operator+(&local_90,&local_b0,", ");
        std::operator+(&local_70,&local_90,&defaultValue);
        std::operator+(&local_d0,&local_70,")");
      }
      std::__cxx11::string::append((string *)&constructor_args);
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar6 && (bVar2 & 1U) == 0) {
        pbVar4 = &local_50;
      }
      else {
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        pbVar4 = &local_b0;
      }
      std::__cxx11::string::~string((string *)pbVar4);
      pbVar4 = &offset;
LAB_00187b64:
      std::__cxx11::string::~string((string *)pbVar4);
    }
    else {
      if (BVar3 == BASE_TYPE_STRUCT) {
        std::operator+(&local_d0,&object_type,&nullableValueAccessOperator);
        std::operator+(&offset,&local_d0,".unpack()");
        std::__cxx11::string::append((string *)&constructor_args);
LAB_001879f6:
        std::__cxx11::string::~string((string *)&offset);
        pbVar4 = &local_d0;
        goto LAB_00187b64;
      }
      std::__cxx11::string::append((string *)&constructor_args);
    }
    std::__cxx11::string::~string((string *)&nullableValueAccessOperator);
    std::__cxx11::string::~string((string *)&defaultValue);
    std::__cxx11::string::~string((string *)&object_type);
    ppVar5 = ppVar5 + 1;
  } while( true );
}

Assistant:

std::string GenStructObjectAPIUnpack(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string constructor_args;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      if (!constructor_args.empty()) constructor_args += ",\n";
      constructor_args += "      " + field_name + ": ";

      const Type &type = field.value.type;
      std::string defaultValue = getDefaultValue(field.value);
      bool isNullable = defaultValue.empty() && !struct_def.fixed;
      std::string nullableValueAccessOperator = isNullable ? "?" : "";
      if (type.base_type == BASE_TYPE_STRUCT) {
        constructor_args +=
            field_name + nullableValueAccessOperator + ".unpack()";
      } else if (type.base_type == BASE_TYPE_VECTOR) {
        if (type.VectorType().base_type == BASE_TYPE_STRUCT) {
          constructor_args += field_name + nullableValueAccessOperator +
                              ".map((e) => e.unpack()).toList()";
        } else {
          constructor_args +=
              GenReaderTypeName(field.value.type, struct_def.defined_namespace,
                                field, false, false);
          constructor_args += ".vTableGet";
          std::string offset = NumToString(field.value.offset);
          constructor_args +=
              isNullable
                  ? "Nullable(_bc, _bcOffset, " + offset + ")"
                  : "(_bc, _bcOffset, " + offset + ", " + defaultValue + ")";
        }
      } else {
        constructor_args += field_name;
      }
    }

    const std::string object_type = namer_.ObjectType(struct_def);
    std::string code = "  " + object_type + " unpack() => " + object_type + "(";
    if (!constructor_args.empty()) code += "\n" + constructor_args;
    code += ");\n";
    return code;
  }